

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void clearbyvalues(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  Node *pNVar2;
  TValue *pTVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  GCObject *pGVar7;
  Node *pNVar8;
  Table *h;
  
  do {
    if (l == f) {
      return;
    }
    pNVar2 = ((Table *)l)->node;
    bVar1 = ((Table *)l)->lsizenode;
    uVar4 = luaH_realasize((Table *)l);
    for (lVar6 = 0; (ulong)uVar4 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
      pTVar3 = ((Table *)l)->array;
      if (((&pTVar3->tt_)[lVar6] & 0x40) == 0) {
        pGVar7 = (GCObject *)0x0;
      }
      else {
        pGVar7 = *(GCObject **)((long)&pTVar3->value_ + lVar6);
      }
      iVar5 = iscleared(g,pGVar7);
      if (iVar5 != 0) {
        (&pTVar3->tt_)[lVar6] = '\x10';
      }
    }
    for (pNVar8 = ((Table *)l)->node; pNVar8 < pNVar2 + (1 << (bVar1 & 0x1f)); pNVar8 = pNVar8 + 1)
    {
      if (((pNVar8->u).tt_ & 0x40) == 0) {
        pGVar7 = (GCObject *)0x0;
      }
      else {
        pGVar7 = (pNVar8->u).value_.gc;
      }
      iVar5 = iscleared(g,pGVar7);
      if (iVar5 == 0) {
        if (((pNVar8->u).tt_ & 0xf) == 0) goto LAB_0010ba79;
      }
      else {
        (pNVar8->u).tt_ = '\x10';
LAB_0010ba79:
        if (((pNVar8->u).key_tt & 0x40) != 0) {
          (pNVar8->u).key_tt = '\v';
        }
      }
    }
    l = ((Table *)l)->gclist;
  } while( true );
}

Assistant:

static void clearbyvalues (global_State *g, GCObject *l, GCObject *f) {
  for (; l != f; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *n, *limit = gnodelast(h);
    unsigned int i;
    unsigned int asize = luaH_realasize(h);
    for (i = 0; i < asize; i++) {
      TValue *o = &h->array[i];
      if (iscleared(g, gcvalueN(o)))  /* value was collected? */
        setempty(o);  /* remove entry */
    }
    for (n = gnode(h, 0); n < limit; n++) {
      if (iscleared(g, gcvalueN(gval(n))))  /* unmarked value? */
        setempty(gval(n));  /* remove entry */
      if (isempty(gval(n)))  /* is entry empty? */
        clearkey(n);  /* clear its key */
    }
  }
}